

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::internal::UnitTestImpl::reportable_disabled_test_count(UnitTestImpl *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  UnitTestImpl *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = SumOverTestCaseList((internal *)&this->test_cases_,
                              (vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                              TestCase::reportable_disabled_test_count,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int UnitTestImpl::reportable_disabled_test_count() const {
  return SumOverTestCaseList(test_cases_,
                             &TestCase::reportable_disabled_test_count);
}